

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi-seq2.c
# Opt level: O0

uint64_t pi_mc(long start,long cnt)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  double dVar5;
  double y;
  double x;
  long cnt_local;
  long start_local;
  
  if (cnt == 1) {
    uVar1 = rng(&seed,0x7fffffff);
    uVar2 = rng(&seed,0x7fffffff);
    dVar5 = sqrt(((double)uVar1 / 2147483647.0) * ((double)uVar1 / 2147483647.0) +
                 ((double)uVar2 / 2147483647.0) * ((double)uVar2 / 2147483647.0));
    start_local = (long)(int)(uint)(dVar5 < 1.0);
  }
  else {
    uVar3 = pi_mc(start,cnt / 2);
    uVar4 = pi_mc(start + cnt / 2,(cnt + 1) / 2);
    start_local = uVar3 + uVar4;
  }
  return start_local;
}

Assistant:

uint64_t pi_mc(long start, long cnt)
{
    if (cnt == 1) {
        double x = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        double y = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        return sqrt(x*x+y*y) < 1.0 ? 1 : 0;
    }
    return pi_mc(start, cnt/2) + pi_mc(start+cnt/2, (cnt+1)/2);
}